

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_mp3_init(ma_read_proc onRead,ma_seek_proc onSeek,ma_tell_proc onTell,
                     void *pReadSeekTellUserData,ma_decoding_backend_config *pConfig,
                     ma_allocation_callbacks *pAllocationCallbacks,ma_mp3 *pMP3)

{
  ma_result mVar1;
  ma_bool32 mVar2;
  
  mVar1 = ma_mp3_init_internal(pConfig,pMP3);
  if ((mVar1 == MA_SUCCESS) &&
     (mVar1 = MA_INVALID_ARGS, onSeek != (ma_seek_proc)0x0 && onRead != (ma_read_proc)0x0)) {
    pMP3->onRead = onRead;
    pMP3->onSeek = onSeek;
    pMP3->onTell = onTell;
    pMP3->pReadSeekTellUserData = pReadSeekTellUserData;
    mVar1 = MA_SUCCESS;
    memset(&pMP3->dr,0,0x3ec0);
    mVar2 = ma_dr_mp3_init_internal
                      (&pMP3->dr,ma_mp3_dr_callback__read,ma_mp3_dr_callback__seek,pMP3,
                       pAllocationCallbacks);
    if (mVar2 == 0) {
      mVar1 = MA_INVALID_FILE;
    }
    else {
      ma_mp3_post_init(pMP3,(ma_decoding_backend_config *)(ulong)pConfig->seekPointCount,
                       pAllocationCallbacks);
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_mp3_init(ma_read_proc onRead, ma_seek_proc onSeek, ma_tell_proc onTell, void* pReadSeekTellUserData, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_mp3* pMP3)
{
    ma_result result;

    result = ma_mp3_init_internal(pConfig, pMP3);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (onRead == NULL || onSeek == NULL) {
        return MA_INVALID_ARGS; /* onRead and onSeek are mandatory. */
    }

    pMP3->onRead = onRead;
    pMP3->onSeek = onSeek;
    pMP3->onTell = onTell;
    pMP3->pReadSeekTellUserData = pReadSeekTellUserData;

    #if !defined(MA_NO_MP3)
    {
        ma_bool32 mp3Result;

        mp3Result = ma_dr_mp3_init(&pMP3->dr, ma_mp3_dr_callback__read, ma_mp3_dr_callback__seek, pMP3, pAllocationCallbacks);
        if (mp3Result != MA_TRUE) {
            return MA_INVALID_FILE;
        }

        ma_mp3_post_init(pMP3, pConfig, pAllocationCallbacks);

        return MA_SUCCESS;
    }
    #else
    {
        /* mp3 is disabled. */
        (void)pAllocationCallbacks;
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}